

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalinterrupt.cpp
# Opt level: O2

void __thiscall util::SignalInterrupt::SignalInterrupt(SignalInterrupt *this)

{
  TokenPipeEnd *this_00;
  long lVar1;
  char *pcVar2;
  TokenPipeEnd *this_01;
  long in_FS_OFFSET;
  TokenPipe local_50;
  undefined8 local_48;
  optional<TokenPipe> pipe;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_flag)._M_base._M_i = false;
  this_00 = &this->m_pipe_r;
  TokenPipeEnd::TokenPipeEnd(this_00,-1);
  this_01 = &this->m_pipe_w;
  TokenPipeEnd::TokenPipeEnd(this_01,-1);
  TokenPipe::Make();
  if (pipe.super__Optional_base<TokenPipe,_false,_false>._M_payload.
      super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>
      ._M_engaged == false) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    local_48 = std::iostream_category();
    local_50.m_fds[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"Could not create TokenPipe");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    TokenPipe::TakeReadEnd(&local_50);
    TokenPipeEnd::Close(this_00);
    this_00->m_fd = local_50.m_fds[0];
    local_50.m_fds[0] = -1;
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)&local_50);
    TokenPipe::TakeWriteEnd(&local_50);
    TokenPipeEnd::Close(this_01);
    this_01->m_fd = local_50.m_fds[0];
    local_50.m_fds[0] = -1;
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)&local_50);
    std::_Optional_payload_base<TokenPipe>::_M_reset((_Optional_payload_base<TokenPipe> *)&pipe);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

SignalInterrupt::SignalInterrupt() : m_flag{false}
{
#ifndef WIN32
    std::optional<TokenPipe> pipe = TokenPipe::Make();
    if (!pipe) throw std::ios_base::failure("Could not create TokenPipe");
    m_pipe_r = pipe->TakeReadEnd();
    m_pipe_w = pipe->TakeWriteEnd();
#endif
}